

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_packet_test.c
# Opt level: O0

int main(void)

{
  void *__ptr;
  size_t size;
  void *data;
  MppPacket packet;
  MPP_RET ret;
  
  packet._4_4_ = 0;
  packet._0_4_ = -2;
  data = (void *)0x0;
  _mpp_log_l(4,"mpp_packet_test","mpp_packet_test start\n",0);
  __ptr = malloc(0x400);
  if (__ptr == (void *)0x0) {
    _mpp_log_l(2,"mpp_packet_test","mpp_packet_test malloc failed\n",0);
  }
  else {
    packet._0_4_ = mpp_packet_init(&data,__ptr,0x400);
    if ((int)packet == 0) {
      mpp_packet_set_eos(data);
      if ((int)packet == 0) {
        mpp_packet_deinit(&data);
        free(__ptr);
        _mpp_log_l(4,"mpp_packet_test","mpp_packet_test success\n",0);
        return (int)packet;
      }
      _mpp_log_l(2,"mpp_packet_test","mpp_packet_test mpp_packet_set_eos failed\n",0);
    }
    else {
      _mpp_log_l(2,"mpp_packet_test","mpp_packet_test mpp_packet_init failed\n",0);
    }
  }
  if (data != (void *)0x0) {
    mpp_packet_deinit(&data);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  _mpp_log_l(4,"mpp_packet_test","mpp_packet_test failed\n",0);
  return (int)packet;
}

Assistant:

int main()
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    MppPacket packet = NULL;
    void *data = NULL;
    size_t size = MPP_PACKET_TEST_SIZE;

    mpp_log("mpp_packet_test start\n");

    data = malloc(size);
    if (NULL == data) {
        mpp_err("mpp_packet_test malloc failed\n");
        goto MPP_PACKET_failed;
    }

    ret = mpp_packet_init(&packet, data, size);
    if (MPP_OK != ret) {
        mpp_err("mpp_packet_test mpp_packet_init failed\n");
        goto MPP_PACKET_failed;
    }
    mpp_packet_set_eos(packet);
    if (MPP_OK != ret) {
        mpp_err("mpp_packet_test mpp_packet_set_eos failed\n");
        goto MPP_PACKET_failed;
    }
    mpp_packet_deinit(&packet);

    free(data);
    mpp_log("mpp_packet_test success\n");
    return ret;

MPP_PACKET_failed:
    if (packet)
        mpp_packet_deinit(&packet);

    if (data)
        free(data);

    mpp_log("mpp_packet_test failed\n");
    return ret;
}